

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,GroupInfo *_groupInfo)

{
  Totals *in_RSI;
  GroupInfo *in_RDI;
  
  *(undefined ***)&in_RDI->name = &PTR__TestGroupStats_0023cb50;
  GroupInfo::GroupInfo((GroupInfo *)in_RSI,in_RDI);
  Totals::Totals(in_RSI);
  in_RDI[2].name.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo )
    :   groupInfo( _groupInfo ),
        aborting( false )
    {}